

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

CTextureHandle __thiscall
CGraphics_Threaded::LoadTexture
          (CGraphics_Threaded *this,char *pFilename,int StorageType,int StoreFormat,int Flags)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  CImageInfo Img;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = str_length(pFilename);
  if (iVar2 < 3) {
    iVar2 = -1;
  }
  else {
    iVar2 = (**(code **)(*(long *)this + 0x70))(this,&Img,pFilename,StorageType);
    if (iVar2 == 0) {
      iVar2 = (this->m_InvalidTexture).m_Id;
    }
    else {
      if (StoreFormat == -1) {
        StoreFormat = Img.m_Format;
      }
      iVar2 = (**(code **)(*(long *)this + 0x80))
                        (this,Img.m_Width,Img.m_Height,Img.m_Format,Img.m_pData,StoreFormat,Flags);
      mem_free(Img.m_pData);
      if ((iVar2 != (this->m_InvalidTexture).m_Id) && (this->m_pConfig->m_Debug != 0)) {
        dbg_msg("graphics/texture","loaded %s",pFilename);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CTextureHandle)iVar2;
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CGraphics_Threaded::LoadTexture(const char *pFilename, int StorageType, int StoreFormat, int Flags)
{
	int l = str_length(pFilename);
	IGraphics::CTextureHandle ID;
	CImageInfo Img;

	if(l < 3)
		return CTextureHandle();
	if(LoadPNG(&Img, pFilename, StorageType))
	{
		if (StoreFormat == CImageInfo::FORMAT_AUTO)
			StoreFormat = Img.m_Format;

		ID = LoadTextureRaw(Img.m_Width, Img.m_Height, Img.m_Format, Img.m_pData, StoreFormat, Flags);
		mem_free(Img.m_pData);
		if(ID.Id() != m_InvalidTexture.Id() && m_pConfig->m_Debug)
			dbg_msg("graphics/texture", "loaded %s", pFilename);
		return ID;
	}

	return m_InvalidTexture;
}